

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * __thiscall Matrix::mulew(Matrix *this,Matrix *mat)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (((this->m_shape).field_0.m_dims[0] == (mat->m_shape).field_0.m_dims[0]) &&
     ((this->m_shape).field_0.m_dims[1] == (mat->m_shape).field_0.m_dims[1])) {
    if ((this->m_shape).field_0.m_dims[0] != 0) {
      pvVar1 = (mat->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (this->m_vals).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        if ((this->m_shape).field_0.m_dims[1] != 0) {
          lVar3 = *(long *)&pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          lVar4 = *(long *)&pvVar2[uVar5].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl;
          uVar6 = 0;
          do {
            *(double *)(lVar4 + uVar6 * 8) =
                 *(double *)(lVar3 + uVar6 * 8) * *(double *)(lVar4 + uVar6 * 8);
            uVar6 = uVar6 + 1;
          } while (uVar6 < (this->m_shape).field_0.m_dims[1]);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (this->m_shape).field_0.m_dims[0]);
    }
    return this;
  }
  std::operator<<((ostream *)&std::cout,
                  "ERROR [element-wise multiplication]: Shapes don\'t match!\n");
  exit(1);
}

Assistant:

Matrix& Matrix::mulew(const Matrix& mat){
    if(m_shape!=mat.m_shape){
        std::cout<<"ERROR [element-wise multiplication]: Shapes don't match!\n";
        exit(1);
    }

    for(uint i=0;i<m_shape.n_row;++i){
        for(uint j=0;j<m_shape.n_col;++j){
            m_vals[i][j]*=mat.m_vals[i][j];
        }
    }
    return *this;
}